

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int CVmObjBigNum::s_getp_pi(vm_val_t *val,uint *argc)

{
  int iVar1;
  vm_obj_id_t obj;
  char *dst;
  vm_val_t *in_RDI;
  char *pi;
  char *new_ext;
  size_t prec;
  size_t in_stack_00000130;
  CVmNativeCodeDesc *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  vm_val_t *in_stack_ffffffffffffffc8;
  
  if ((s_getp_pi(vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&s_getp_pi(vm_val_t*,unsigned_int*)::desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&s_getp_pi::desc,1);
    __cxa_guard_release(&s_getp_pi(vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffc8,
                     (uint *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
  if (iVar1 == 0) {
    CVmBif::pop_int_val();
    obj = create(in_stack_ffffffffffffffc4,(size_t)in_RDI);
    vm_val_t::set_obj(in_RDI,obj);
    get_objid_ext(0);
    dst = cache_pi(in_stack_00000130);
    copy_val(dst,(char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  }
  return 1;
}

Assistant:

int CVmObjBigNum::s_getp_pi(VMG_ vm_val_t *val, uint *argc)
{
    size_t prec;
    char *new_ext;
    const char *pi;
    static CVmNativeCodeDesc desc(1);
    
    /* check arguments */
    if (get_prop_check_argc(val, argc, &desc))
        return TRUE;

    /* get the precision argument */
    prec = CVmBif::pop_int_val(vmg0_);

    /* allocate the result */
    val->set_obj(create(vmg_ FALSE, prec));
    new_ext = get_objid_ext(vmg_ val->val.obj);

    /* cache pi to the required precision */
    pi = cache_pi(prec);

    /* return the value */
    copy_val(new_ext, pi, TRUE);

    /* handled */
    return TRUE;
}